

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rate_hist.c
# Opt level: O3

void update_rate_histogram(rate_hist *hist,aom_codec_enc_cfg_t *cfg,aom_codec_cx_pkt_t *pkt)

{
  int64_t *piVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  
  uVar4 = (ulong)((long)(cfg->g_timebase).num * (pkt->data).frame.pts * 1000) /
          (ulong)(long)(cfg->g_timebase).den;
  if (pkt != (aom_codec_cx_pkt_t *)0x0 &&
      (cfg != (aom_codec_enc_cfg_t *)0x0 && hist != (rate_hist *)0x0)) {
    iVar6 = hist->frames;
    hist->frames = iVar6 + 1;
    iVar6 = iVar6 % hist->samples;
    piVar1 = hist->pts;
    piVar1[iVar6] = uVar4;
    piVar5 = hist->sz;
    piVar5[iVar6] = (pkt->data).psnr.samples[2];
    if ((((long)(ulong)cfg->rc_buf_initial_sz <= (long)uVar4) && (cfg->rc_target_bitrate != 0)) &&
       (0 < hist->frames)) {
      iVar6 = hist->samples;
      if (iVar6 < 1) {
        lVar8 = 0;
        uVar9 = uVar4;
      }
      else {
        lVar8 = 0;
        uVar11 = hist->frames;
        iVar10 = 1;
        do {
          uVar7 = (long)(int)(uVar11 - 1) % (long)iVar6 & 0xffffffff;
          uVar9 = piVar1[uVar7];
          if (((long)(ulong)cfg->rc_buf_sz < (long)(uVar4 - uVar9)) ||
             (lVar8 = lVar8 + piVar5[uVar7], uVar11 < 2)) break;
          bVar2 = iVar10 < iVar6;
          uVar11 = uVar11 - 1;
          iVar10 = iVar10 + 1;
        } while (bVar2);
        lVar8 = lVar8 * 8000;
      }
      if (uVar4 - uVar9 != 0) {
        lVar8 = lVar8 / (long)(uVar4 - uVar9);
        uVar3 = (uint)((lVar8 * 0x32) / (long)(ulong)(cfg->rc_target_bitrate * 1000));
        uVar11 = 0;
        if (0 < (int)uVar3) {
          uVar11 = uVar3;
        }
        uVar4 = 99;
        if ((int)uVar11 < 99) {
          uVar4 = (ulong)uVar11;
        }
        uVar4 = uVar4 * 3 & 0xffffffff;
        piVar5 = &hist->bucket[0].low + uVar4;
        if (lVar8 < *piVar5) {
          *piVar5 = (int)lVar8;
        }
        if ((&hist->bucket[0].high)[uVar4] < lVar8) {
          (&hist->bucket[0].high)[uVar4] = (int)lVar8;
        }
        piVar5 = &hist->bucket[0].count + uVar4;
        *piVar5 = *piVar5 + 1;
        hist->total = hist->total + 1;
      }
    }
  }
  return;
}

Assistant:

void update_rate_histogram(struct rate_hist *hist,
                           const aom_codec_enc_cfg_t *cfg,
                           const aom_codec_cx_pkt_t *pkt) {
  int i;
  int64_t then = 0;
  int64_t avg_bitrate = 0;
  int64_t sum_sz = 0;
  const int64_t now = pkt->data.frame.pts * 1000 *
                      (uint64_t)cfg->g_timebase.num /
                      (uint64_t)cfg->g_timebase.den;

  int idx;

  if (hist == NULL || cfg == NULL || pkt == NULL) return;

  idx = hist->frames++ % hist->samples;
  hist->pts[idx] = now;
  hist->sz[idx] = (int)pkt->data.frame.sz;

  if (now < cfg->rc_buf_initial_sz) return;

  if (!cfg->rc_target_bitrate) return;

  then = now;

  /* Sum the size over the past rc_buf_sz ms */
  for (i = hist->frames; i > 0 && hist->frames - i < hist->samples; i--) {
    const int i_idx = (i - 1) % hist->samples;

    then = hist->pts[i_idx];
    if (now - then > cfg->rc_buf_sz) break;
    sum_sz += hist->sz[i_idx];
  }

  if (now == then) return;

  avg_bitrate = sum_sz * 8 * 1000 / (now - then);
  idx = (int)(avg_bitrate * (RATE_BINS / 2) / (cfg->rc_target_bitrate * 1000));
  if (idx < 0) idx = 0;
  if (idx > RATE_BINS - 1) idx = RATE_BINS - 1;
  if (hist->bucket[idx].low > avg_bitrate)
    hist->bucket[idx].low = (int)avg_bitrate;
  if (hist->bucket[idx].high < avg_bitrate)
    hist->bucket[idx].high = (int)avg_bitrate;
  hist->bucket[idx].count++;
  hist->total++;
}